

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

cram_codec * cram_beta_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *pcVar2;
  code *pcVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  pcVar2 = (cram_codec *)malloc(0x240);
  if (pcVar2 != (cram_codec *)0x0) {
    pcVar2->codec = E_BETA;
    if (option - E_INT < 2) {
      pcVar3 = cram_beta_decode_int;
    }
    else {
      if (1 < option - E_BYTE) {
        abort();
      }
      pcVar3 = cram_beta_decode_char;
    }
    pcVar2->decode = pcVar3;
    pcVar2->free = cram_beta_decode_free;
    bVar1 = *data;
    uVar6 = (uint)bVar1;
    lVar4 = 1;
    if ((char)bVar1 < '\0') {
      uVar5 = (uint)bVar1;
      uVar6 = (uint)(byte)data[1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar5 & 0x3f) << 8 | uVar6;
        lVar7 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar5 & 0x1f) << 0x10 | uVar6 << 8 | (uint)(byte)data[2];
        lVar7 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar5 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)(byte)data[2] << 8 |
                (uint)(byte)data[3];
        lVar7 = 4;
      }
      else {
        uVar6 = (byte)data[4] & 0xf |
                (uint)(byte)data[3] << 4 |
                (uint)(byte)data[2] << 0xc | uVar6 << 0x14 | uVar5 << 0x1c;
        lVar7 = 5;
      }
    }
    else {
      lVar7 = 1;
    }
    *(uint *)&pcVar2->field_6 = uVar6;
    bVar1 = data[lVar7];
    uVar6 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar5 = (uint)bVar1;
      uVar6 = (uint)(byte)data[lVar7 + 1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar5 & 0x3f) << 8 | uVar6;
        lVar4 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar5 & 0x1f) << 0x10 | uVar6 << 8 | (uint)(byte)data[lVar7 + 2];
        lVar4 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar5 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)(byte)data[lVar7 + 2] << 8 |
                (uint)(byte)data[lVar7 + 3];
        lVar4 = 4;
      }
      else {
        uVar6 = (byte)data[lVar7 + 4] & 0xf |
                (uint)(byte)data[lVar7 + 3] << 4 |
                (uint)(byte)data[lVar7 + 2] << 0xc | uVar6 << 0x14 | uVar5 << 0x1c;
        lVar4 = 5;
      }
    }
    *(uint *)((long)&pcVar2->field_6 + 4) = uVar6;
    if (lVar4 + lVar7 == (long)size) {
      return pcVar2;
    }
    cram_beta_decode_init_cold_1();
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_beta_decode_init(char *data, int size,
				  enum cram_external_type option,
				  int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BETA;
    if (option == E_INT || option == E_LONG)
	c->decode = cram_beta_decode_int;
    else if (option == E_BYTE_ARRAY || option == E_BYTE)
	c->decode = cram_beta_decode_char;
    else
	abort();
    c->free   = cram_beta_decode_free;
    
    cp += itf8_get(cp, &c->beta.offset);
    cp += itf8_get(cp, &c->beta.nbits);

    if (cp - data != size) {
	fprintf(stderr, "Malformed beta header stream\n");
	free(c);
	return NULL;
    }

    return c;
}